

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbsptree.cpp
# Opt level: O0

void __thiscall QBspTree::create(QBspTree *this,int n,int d)

{
  uint *puVar1;
  uint in_EDX;
  int in_ESI;
  uint *in_RDI;
  long in_FS_OFFSET;
  int c;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0xffffffff) {
    in_stack_ffffffffffffffdc = 0;
    for (; in_ESI != 0; in_ESI = in_ESI / 10) {
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1;
    }
    *in_RDI = in_stack_ffffffffffffffdc << 1;
    in_ESI = 0;
  }
  else {
    *in_RDI = in_EDX;
  }
  local_c = 1;
  puVar1 = qMax<unsigned_int>(in_RDI,&local_c);
  *in_RDI = *puVar1;
  QList<QBspTree::Node>::resize
            ((QList<QBspTree::Node> *)CONCAT44(in_ESI,in_EDX),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  QList<QList<int>_>::resize
            ((QList<QList<int>_> *)CONCAT44(in_ESI,in_EDX),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBspTree::create(int n, int d)
{
    // simple heuristics to find the best tree depth
    if (d == -1) {
        int c;
        for (c = 0; n; ++c)
            n = n / 10;
        depth = c << 1;
    } else {
        depth = d;
    }
    depth = qMax(depth, uint(1));

    nodes.resize((1ll << depth) - 1); // resize to number of nodes
    leaves.resize(1ll << depth); // resize to number of leaves
}